

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_join(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int toLocaleString)

{
  int iVar1;
  int64_t iVar2;
  uint32_t c;
  long lVar3;
  JSValue JVar4;
  JSValue val;
  JSValue JVar5;
  JSValueUnion local_70;
  int64_t n;
  StringBuffer local_50;
  
  JVar4 = JS_ToObject(ctx,this_val);
  iVar1 = js_get_length64(ctx,&n,JVar4);
  if (iVar1 == 0) {
    c = 0x2c;
    JVar5 = (JSValue)(ZEXT816(3) << 0x40);
    if (0 < argc && toLocaleString == 0) {
      JVar5 = (JSValue)(ZEXT816(3) << 0x40);
      if ((int)argv->tag != 3) {
        JVar5.tag = argv->tag;
        JVar5.u.ptr = (argv->u).ptr;
        JVar5 = JS_ToString(ctx,JVar5);
        if ((int)JVar5.tag == 6) goto LAB_00154b55;
        if (*(int *)((long)JVar5.u.ptr + 4) == 1) {
          c = (uint32_t)*(byte *)((long)JVar5.u.ptr + 0x10);
        }
        else {
          c = 0xffffffff;
        }
      }
    }
    lVar3 = 0;
    string_buffer_init(ctx,&local_50,0);
    iVar2 = n;
    if (n < 1) {
      iVar2 = lVar3;
    }
    for (; local_70 = JVar5.u, iVar2 != lVar3; lVar3 = lVar3 + 1) {
      if (lVar3 != 0) {
        if ((int)c < 0) {
          string_buffer_concat
                    (&local_50,(JSString *)local_70.ptr,0,
                     *(uint *)((long)local_70.ptr + 4) & 0x7fffffff);
        }
        else {
          string_buffer_putc8(&local_50,c);
        }
      }
      val = JS_GetPropertyUint32(ctx,JVar4,(uint32_t)lVar3);
      if (1 < (int)val.tag - 2U) {
        if ((int)val.tag != 6) {
          if (toLocaleString != 0) {
            val = JS_ToLocaleStringFree(ctx,val);
          }
          iVar1 = string_buffer_concat_value_free(&local_50,val);
          if (iVar1 == 0) goto LAB_00154c45;
        }
        (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
        JS_FreeValue(ctx,JVar5);
        goto LAB_00154b55;
      }
LAB_00154c45:
    }
    JS_FreeValue(ctx,JVar5);
    JS_FreeValue(ctx,JVar4);
    JVar4 = string_buffer_end(&local_50);
  }
  else {
LAB_00154b55:
    JS_FreeValue(ctx,JVar4);
    JVar4 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar4;
}

Assistant:

static JSValue js_array_join(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int toLocaleString)
{
    JSValue obj, sep = JS_UNDEFINED, el;
    StringBuffer b_s, *b = &b_s;
    JSString *p = NULL;
    int64_t i, n;
    int c;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &n, obj))
        goto exception;

    c = ',';    /* default separator */
    if (!toLocaleString && argc > 0 && !JS_IsUndefined(argv[0])) {
        sep = JS_ToString(ctx, argv[0]);
        if (JS_IsException(sep))
            goto exception;
        p = JS_VALUE_GET_STRING(sep);
        if (p->len == 1 && !p->is_wide_char)
            c = p->u.str8[0];
        else
            c = -1;
    }
    string_buffer_init(ctx, b, 0);

    for(i = 0; i < n; i++) {
        if (i > 0) {
            if (c >= 0) {
                string_buffer_putc8(b, c);
            } else {
                string_buffer_concat(b, p, 0, p->len);
            }
        }
        el = JS_GetPropertyUint32(ctx, obj, i);
        if (JS_IsException(el))
            goto fail;
        if (!JS_IsNull(el) && !JS_IsUndefined(el)) {
            if (toLocaleString) {
                el = JS_ToLocaleStringFree(ctx, el);
            }
            if (string_buffer_concat_value_free(b, el))
                goto fail;
        }
    }
    JS_FreeValue(ctx, sep);
    JS_FreeValue(ctx, obj);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
    JS_FreeValue(ctx, sep);
exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}